

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsElfRelocator.cpp
# Opt level: O2

bool __thiscall
MipsElfRelocator::relocateOpcode
          (MipsElfRelocator *this,int type,RelocationData *data,
          vector<RelocationAction,_std::allocator<RelocationAction>_> *actions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *errors)

{
  uint lo16Opcode;
  bool bVar1;
  uint op;
  uint local_48;
  int local_44;
  string local_40;
  
  lo16Opcode = data->opcode;
  local_48 = lo16Opcode;
  local_44 = type;
  switch(type) {
  case 2:
    local_48 = lo16Opcode + (int)data->relocationBase;
    break;
  default:
    tinyformat::format<int>(&local_40,"Unknown MIPS relocation type %d",&local_44);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)errors,&local_40
              );
    std::__cxx11::string::~string((string *)&local_40);
    return false;
  case 4:
    local_48 = ((uint)data->relocationBase >> 2) + lo16Opcode & 0x3ffffff | lo16Opcode & 0xfc000000;
    break;
  case 5:
    std::vector<MipsElfRelocator::Hi16Entry,std::allocator<MipsElfRelocator::Hi16Entry>>::
    emplace_back<long_const&,long_const&,unsigned_int_const&>
              ((vector<MipsElfRelocator::Hi16Entry,std::allocator<MipsElfRelocator::Hi16Entry>> *)
               &this->hi16Entries,&data->opcodeOffset,&data->relocationBase,&data->opcode);
    break;
  case 6:
    bVar1 = processHi16Entries(this,lo16Opcode,data->relocationBase,actions,errors);
    local_48 = lo16Opcode + (int)data->relocationBase & 0xffff | lo16Opcode & 0xffff0000;
    goto LAB_0015808e;
  }
  bVar1 = true;
LAB_0015808e:
  std::vector<RelocationAction,std::allocator<RelocationAction>>::
  emplace_back<long_const&,unsigned_int&>
            ((vector<RelocationAction,std::allocator<RelocationAction>> *)actions,
             &data->opcodeOffset,&local_48);
  return bVar1;
}

Assistant:

bool MipsElfRelocator::relocateOpcode(int type, const RelocationData& data, std::vector<RelocationAction>& actions, std::vector<std::string>& errors)
{
	unsigned int op = data.opcode;
	bool result = true;

	switch (type)
	{
	case R_MIPS_26: //j, jal
		op = (op & 0xFC000000) | (((op&0x03FFFFFF)+(data.relocationBase>>2))&0x03FFFFFF);
		break;
	case R_MIPS_32:
		op += (int) data.relocationBase;
		break;
	case R_MIPS_HI16:
		hi16Entries.emplace_back(data.opcodeOffset, data.relocationBase, data.opcode);
		break;
	case R_MIPS_LO16:
		if (!processHi16Entries(op, data.relocationBase, actions, errors))
			result = false;
		op = (op&0xffff0000) | (((op&0xffff)+data.relocationBase)&0xffff);
		break;
	default:
		errors.emplace_back(tfm::format("Unknown MIPS relocation type %d",type));
		return false;
	}

	actions.emplace_back(data.opcodeOffset, op);
	return result;
}